

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O2

void __thiscall HDual::setCrash(HDual *this,char *Crash_ArgV)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  
  iVar1 = strcmp(Crash_ArgV,"Off");
  iVar2 = 0;
  if (iVar1 != 0) {
    iVar1 = strcmp(Crash_ArgV,"LTSSF");
    iVar2 = 2;
    if (iVar1 != 0) {
      iVar1 = strcmp(Crash_ArgV,"LTSSF1");
      if (iVar1 == 0) {
        iVar2 = 1;
      }
      else {
        iVar1 = strcmp(Crash_ArgV,"LTSSF2");
        if (iVar1 != 0) {
          iVar2 = strcmp(Crash_ArgV,"LTSSF3");
          if (iVar2 == 0) {
            iVar2 = 3;
          }
          else {
            iVar2 = strcmp(Crash_ArgV,"LTSSF4");
            if (iVar2 == 0) {
              iVar2 = 4;
            }
            else {
              iVar2 = strcmp(Crash_ArgV,"LTSSF5");
              if (iVar2 == 0) {
                iVar2 = 5;
              }
              else {
                iVar2 = strcmp(Crash_ArgV,"LTSSF6");
                if (iVar2 == 0) {
                  iVar2 = 6;
                }
                else {
                  iVar2 = strcmp(Crash_ArgV,"LTSSF7");
                  if (iVar2 == 0) {
                    iVar2 = 7;
                  }
                  else {
                    poVar3 = std::operator<<((ostream *)&std::cout,
                                             "HDual::setCrash unrecognised CrashArgV = ");
                    poVar3 = std::operator<<(poVar3,Crash_ArgV);
                    poVar3 = std::operator<<(poVar3," - using No crash");
                    std::endl<char,std::char_traits<char>>(poVar3);
                    iVar2 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  this->Crash_Mode = iVar2;
  return;
}

Assistant:

void HDual::setCrash(const char *Crash_ArgV) {
  //	cout << "HDual::setCrash Crash_ArgV = " << Crash_ArgV << endl;
	if (strcmp(Crash_ArgV, "Off") == 0)
		Crash_Mode = Crash_Mode_No;
	else if (strcmp(Crash_ArgV, "LTSSF") == 0)
		Crash_Mode = Crash_Mode_Df;
	else if (strcmp(Crash_ArgV, "LTSSF1") == 0)
		Crash_Mode = Crash_Mode_LTSSF_k;
	else if (strcmp(Crash_ArgV, "LTSSF2") == 0)
		Crash_Mode = Crash_Mode_LTSSF_pri;
	else if (strcmp(Crash_ArgV, "LTSSF3") == 0)
		Crash_Mode = Crash_Mode_LTSF_k;
	else if (strcmp(Crash_ArgV, "LTSSF4") == 0)
		Crash_Mode = Crash_Mode_LTSF_pri;
	else if (strcmp(Crash_ArgV, "LTSSF5") == 0)
		Crash_Mode = Crash_Mode_LTSF;
	else if (strcmp(Crash_ArgV, "LTSSF6") == 0)
		Crash_Mode = Crash_Mode_Bixby;
	else if (strcmp(Crash_ArgV, "LTSSF7") == 0)
		Crash_Mode = Crash_Mode_Dev;
	else {
		cout << "HDual::setCrash unrecognised CrashArgV = " << Crash_ArgV
				<< " - using No crash" << endl;
		Crash_Mode = Crash_Mode_No;
	}
//	if (Crash_Mode == Crash_Mode_LTSSF) {
//		crash.ltssf_iz_mode(Crash_Mode);
//	}
//		cout<<"HDual::setCrash Crash_Mode = " << Crash_Mode << endl;
}